

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfoManager.cpp
# Opt level: O1

IdleDecommitSignal __thiscall
Memory::HeapInfoManager::LeaveIdleDecommit(HeapInfoManager *this,bool allowTimer)

{
  IdleDecommitSignal IVar1;
  
  IVar1 = HeapInfo::LeaveIdleDecommit(&this->defaultHeap,allowTimer);
  if ((int)IVar1 < 1) {
    IVar1 = IdleDecommitSignal_None;
  }
  return IVar1;
}

Assistant:

IdleDecommitSignal
HeapInfoManager::LeaveIdleDecommit(bool allowTimer)
{
    IdleDecommitSignal idleDecommitSignal = IdleDecommitSignal_None;
    ForEachHeapInfo([&idleDecommitSignal, allowTimer](HeapInfo& heapInfo)
    {
        IdleDecommitSignal signal = heapInfo.LeaveIdleDecommit(allowTimer);
        idleDecommitSignal = max(idleDecommitSignal, signal);
    });
    return idleDecommitSignal;
}